

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_beeper.cpp
# Opt level: O0

void __thiscall sdl::beeper::beeper(beeper *this,uint16_t freq,uint8_t amplitude)

{
  SDL_AudioDeviceID SVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __0 local_69;
  undefined1 local_68 [8];
  SDL_AudioSpec obtained;
  SDL_AudioSpec desired;
  uint8_t amplitude_local;
  uint16_t freq_local;
  beeper *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_sample_cache);
  SDL_LogDebug(4,"Creating beeper with %hu Hz and amplitude of %hhu",freq,amplitude);
  obtained.userdata = (void *)CONCAT17(0,CONCAT16(1,CONCAT24(8,(uint)freq * 2)));
  beeper(unsigned_short,unsigned_char)::$_0::operator_cast_to_function_pointer(&local_69);
  SVar1 = SDL_OpenAudioDevice(0,0,&obtained.userdata,local_68,1);
  this->m_audio_device = SVar1;
  SVar1 = this->m_audio_device;
  s_abi_cxx11_(&local_90,"Unable to open audio device",0x1b);
  sdl_check_error(SVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  anon_unknown.dwarf_1bae8::generate_sample_cache
            (&local_a8,(SDL_AudioSpec *)local_68,freq,amplitude);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_sample_cache,&local_a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a8);
  return;
}

Assistant:

beeper::beeper(uint16_t freq, uint8_t amplitude)
{
	SDL_LogDebug(SDL_LOG_CATEGORY_AUDIO, "Creating beeper with %hu Hz and amplitude of %hhu",
		freq, amplitude);

	SDL_AudioSpec desired;
	SDL_AudioSpec obtained;

	std::memset(&desired, 0, sizeof(desired));

	desired.freq = freq * 2;
	desired.format = AUDIO_U8;
	desired.channels = 1;
	desired.samples = 32; // TODO: Tune this, since this is a throughput-vs-latency thing
	desired.callback = +[](void* user_data, Uint8* stream, int len) -> void
	{
		if (len == 0)
			return;

		const auto& buffer = *reinterpret_cast<std::vector<uint8_t>*>(user_data);
		if (len > buffer.size())
		{
			SDL_LogWarn(SDL_LOG_CATEGORY_AUDIO, "More samples requested than was cached, "
				"truncating with silence. Requested: %d, cached: %d", len, buffer.size());

			std::memset(stream + buffer.size(), 0, len - buffer.size());
			len = buffer.size();
		}
		std::memcpy(stream, buffer.data(), len);
	};
	desired.userdata = &this->m_sample_cache;

	this->m_audio_device = SDL_OpenAudioDevice(nullptr, 0, &desired, &obtained,
		SDL_AUDIO_ALLOW_FREQUENCY_CHANGE);
	sdl::sdl_check_error(this->m_audio_device, "Unable to open audio device"s);

	this->m_sample_cache = generate_sample_cache(obtained, freq, amplitude);
}